

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_STOCHF_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                 int *outNBElement)

{
  TA_RetCode TVar1;
  undefined8 unaff_RBP;
  double *unaff_retaddr;
  double *in_stack_00000008;
  double *in_stack_00000010;
  int in_stack_0000001c;
  int in_stack_00000020;
  double *in_stack_00000050;
  double *in_stack_00000058;
  
  TVar1 = TA_STOCHF(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_00000008,
                    unaff_retaddr,(int)((ulong)unaff_RBP >> 0x20),(int)outNBElement,
                    (TA_MAType)outBegIdx,(int *)CONCAT44(startIdx,endIdx),(int *)params,
                    in_stack_00000050,in_stack_00000058);
  return TVar1;
}

Assistant:

TA_RetCode TA_STOCHF_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_STOCHF(
/* Generated */                startIdx,
/* Generated */                endIdx,
/* Generated */                params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                params->in[0].data.inPrice.low, /* inLow */
/* Generated */                params->in[0].data.inPrice.close, /* inClose */
/* Generated */                params->optIn[0].data.optInInteger, /* optInFastK_Period*/
/* Generated */                params->optIn[1].data.optInInteger, /* optInFastD_Period*/
/* Generated */                (TA_MAType)params->optIn[2].data.optInInteger, /* optInFastD_MAType*/
/* Generated */                outBegIdx, 
/* Generated */                outNBElement, 
/* Generated */                params->out[0].data.outReal, /*  outFastK */
/* Generated */                params->out[1].data.outReal /*  outFastD */ );
/* Generated */ }